

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPlanning.cpp
# Opt level: O1

ValueFunctionPOMDPDiscrete *
AlphaVectorPlanning::ImportValueFunction
          (ValueFunctionPOMDPDiscrete *__return_storage_ptr__,string *filename)

{
  int iVar1;
  char cVar2;
  ostream *poVar3;
  istream *piVar4;
  undefined8 *puVar5;
  bool bVar6;
  long lVar7;
  int iVar8;
  vector<long_long,_std::allocator<long_long>_> actionBetaI;
  vector<double,_std::allocator<double>_> values;
  string buffer;
  BGPolicyIndex actionOrBetaI;
  double value;
  istringstream is;
  ifstream fp;
  Index local_444;
  int local_440;
  LIndex *local_438;
  iterator iStack_430;
  longlong *local_428;
  double *local_418;
  iterator iStack_410;
  double *local_408;
  LIndex local_3f8;
  undefined1 *local_3f0;
  undefined8 local_3e8;
  undefined1 local_3e0;
  undefined7 uStack_3df;
  ValueFunctionPOMDPDiscrete *local_3d0;
  longlong local_3c8;
  double local_3c0;
  AlphaVector local_3b8 [3];
  ios_base local_340 [264];
  long local_238 [4];
  byte abStack_218 [488];
  
  (__return_storage_ptr__->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_408 = (double *)0x0;
  local_418 = (double *)0x0;
  iStack_410._M_current = (double *)0x0;
  local_428 = (longlong *)0x0;
  local_438 = (LIndex *)0x0;
  iStack_430._M_current = (longlong *)0x0;
  local_3d0 = __return_storage_ptr__;
  std::ifstream::ifstream((istream *)local_238,(filename->_M_dataplus)._M_p,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"AlphaVectorPlanning::ImportValueFunction: failed to ",0x34);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"open file ",10);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(filename->_M_dataplus)._M_p,
                        filename->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  local_3f0 = &local_3e0;
  local_3e8 = 0;
  local_3e0 = 0;
  local_3f8 = 0xffffffffffffffff;
  bVar6 = true;
  local_440 = -1;
  local_444 = 0;
  iVar1 = 0;
  while( true ) {
    while( true ) {
      while( true ) {
        do {
          iVar8 = iVar1;
          cVar2 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                                  (char)(istream *)local_238);
          piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)local_238,(string *)&local_3f0,cVar2);
          if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 2) != 0) {
            if (local_3f0 != &local_3e0) {
              operator_delete(local_3f0,CONCAT71(uStack_3df,local_3e0) + 1);
            }
            std::ifstream::~ifstream(local_238);
            if (local_438 != (LIndex *)0x0) {
              operator_delete(local_438,(long)local_428 - (long)local_438);
            }
            if (local_418 != (double *)0x0) {
              operator_delete(local_418,(long)local_408 - (long)local_418);
            }
            return local_3d0;
          }
          iVar1 = 0;
        } while (iVar8 == 2);
        if (iVar8 == 0) break;
        if (iStack_410._M_current != local_418) {
          iStack_410._M_current = local_418;
        }
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)local_3b8,(string *)&local_3f0,_S_in);
        while (piVar4 = std::istream::_M_extract<double>((double *)local_3b8),
              ((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) == 0) {
          if (iStack_410._M_current == local_408) {
            std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                      ((vector<double,std::allocator<double>> *)&local_418,iStack_410,&local_3c0);
          }
          else {
            *iStack_410._M_current = local_3c0;
            iStack_410._M_current = iStack_410._M_current + 1;
          }
        }
        std::__cxx11::istringstream::~istringstream((istringstream *)local_3b8);
        std::ios_base::~ios_base(local_340);
        if (bVar6) {
          local_440 = (int)((ulong)((long)iStack_410._M_current - (long)local_418) >> 3);
          bVar6 = false;
        }
        AlphaVector::AlphaVector(local_3b8,(long)local_440);
        local_3b8[0]._m_action = local_444;
        AlphaVector::SetValues(local_3b8,(vector<double,_std::allocator<double>_> *)&local_418);
        if (local_3f8 != local_3b8[0]._m_betaI) {
          AlphaVector::SetBetaI(local_3b8,local_3f8);
        }
        std::vector<AlphaVector,_std::allocator<AlphaVector>_>::push_back(local_3d0,local_3b8);
        AlphaVector::~AlphaVector(local_3b8);
        iVar1 = 2;
      }
      if ((LIndex *)iStack_430._M_current != local_438) {
        iStack_430._M_current = (longlong *)local_438;
      }
      std::__cxx11::istringstream::istringstream
                ((istringstream *)local_3b8,(string *)&local_3f0,_S_in);
      while (piVar4 = std::istream::_M_extract<long_long>((longlong *)local_3b8),
            ((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) == 0) {
        if (iStack_430._M_current == local_428) {
          std::vector<long_long,std::allocator<long_long>>::_M_realloc_insert<long_long_const&>
                    ((vector<long_long,std::allocator<long_long>> *)&local_438,iStack_430,&local_3c8
                    );
        }
        else {
          *iStack_430._M_current = local_3c8;
          iStack_430._M_current = iStack_430._M_current + 1;
        }
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)local_3b8);
      std::ios_base::~ios_base(local_340);
      lVar7 = (long)iStack_430._M_current - (long)local_438 >> 3;
      if (lVar7 != 1) break;
      local_3f8 = 0xffffffffffffffff;
      local_444 = Globals::CastLIndexToIndex(*local_438);
      iVar1 = 1;
    }
    if (lVar7 != 2) break;
    local_444 = Globals::CastLIndexToIndex(*local_438);
    local_3f8 = local_438[1];
    iVar1 = 1;
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(0x28);
  *puVar5 = &PTR__E_0059bd80;
  puVar5[1] = puVar5 + 3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(puVar5 + 1),"AlphaVectorPlanning::ImportValueFunction parse error","");
  __cxa_throw(puVar5,&E::typeinfo,E::~E);
}

Assistant:

ValueFunctionPOMDPDiscrete 
AlphaVectorPlanning::ImportValueFunction(const string & filename)
{
    ValueFunctionPOMDPDiscrete V;

    int lineState=0; /* lineState=0 -> read action
                      * lineState=1 -> read values
                      * lineState=2 -> empty line, skip */
    int nrStates=-1;
    bool first=true;
    Index action=0;
    AlphaVector::BGPolicyIndex betaI=-1;
    double value;
    vector<double> values;
    vector<AlphaVector::BGPolicyIndex> actionBetaI;
    AlphaVector::BGPolicyIndex actionOrBetaI;

    ifstream fp(filename.c_str());
    if(!fp)
    {
        cerr << "AlphaVectorPlanning::ImportValueFunction: failed to "
             << "open file " << filename << endl;            
    }

    string buffer;
    while(!getline(fp,buffer).eof())
    {
        switch(lineState)
        {
        case 0:
            // read action
//            action=strtol(buffer,NULL,10);
            actionBetaI.clear();
            {
                istringstream is(buffer);
                while(is >> actionOrBetaI)
                    actionBetaI.push_back(actionOrBetaI);
            }

            switch(actionBetaI.size())
            {
            case 1:
                action=CastLIndexToIndex(actionBetaI[0]);
                betaI=-1;
                break;
            case 2:
                action=CastLIndexToIndex(actionBetaI[0]);
                betaI=actionBetaI[1];
                break;
            default:
                throw(E("AlphaVectorPlanning::ImportValueFunction parse error"));
            }

            lineState++;
            break;
        case 1:
            // read values
            values.clear();

            {
                istringstream is(buffer);
                while(is >> value)
                    values.push_back(value);
            }
            
            if(first)
            {
                nrStates=values.size();
                first=false;
            }
            
            // create new alpha vector and store it
            {
                AlphaVector alpha(nrStates);
                alpha.SetAction(action);
                alpha.SetValues(values);
                // only set betaI if different than default, to avoid
                // setting it to -1
                if(betaI!=alpha.GetBetaI())
                    alpha.SetBetaI(betaI);

#if DEBUG_AlphaVectorPlanning_ImportValueFunction
                cout << "AlphaVectorPlanning::ImportValueFunction "
                     << "added vector " << V.size() << " for action " 
                     << action << " betaI " << betaI << endl;
#endif

                V.push_back(alpha);
            }

            lineState++;
            break;
        case 2:
            // do nothing, line is empty
            lineState=0;
            break;
        }
    }

    return(V);
}